

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_message_digester.hxx
# Opt level: O2

uchar * __thiscall
cryptox::
evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_sha1,160ul>,&EVP_DigestInit_ex,&EVP_DigestUpdate,&EVP_DigestFinal_ex>
::update<unsigned_char_const*>
          (evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_sha1,160ul>,&EVP_DigestInit_ex,&EVP_DigestUpdate,&EVP_DigestFinal_ex>
           *this,uchar *first,uchar *last)

{
  uchar *puVar1;
  int iVar2;
  size_t cnt;
  uint8_t buffer [1024];
  source_location local_470;
  evp_error local_458;
  uchar local_428 [1032];
  
  do {
    if (first == last) {
      return first;
    }
    for (cnt = 0; (puVar1 = first + cnt, cnt < 0x3ff && (puVar1 != last)); cnt = cnt + 1) {
      local_428[cnt] = *puVar1;
    }
    iVar2 = EVP_DigestUpdate(*(EVP_MD_CTX **)this,local_428,cnt);
    first = puVar1;
  } while (iVar2 == 1);
  local_458._32_8_ = 0;
  local_458._16_8_ = 0;
  local_458._24_8_ = 0;
  local_458._40_8_ = 0xffffffff;
  local_458._0_8_ = 0x2b7668;
  local_458._8_8_ = 0x2b7698;
  local_470.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/include/cryptox/message_digests/basic_message_digester.hxx"
  ;
  local_470.function_ =
       "Input cryptox::evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_sha1, 160>, &EVP_DigestInit_ex, &EVP_DigestUpdate, &EVP_DigestFinal_ex>::update(Input, Input) [Algorithm = cryptox::message_digest_algorithm<&EVP_sha1, 160>, InitFx = &EVP_DigestInit_ex, UpdateFx = &EVP_DigestUpdate, FinalFx = &EVP_DigestFinal_ex, Input = const unsigned char *]"
  ;
  local_470.line_ = 0x3f;
  local_470.column_ = 0;
  boost::throw_exception<cryptox::evp_error>(&local_458,&local_470);
}

Assistant:

Input update(Input first, Input last) {
			Input itr = first;

			while (itr != last) {
				std::uint8_t buffer[1024];
				size_t size = 0;

				const std::size_t element_size = sizeof(*itr);
				while (size + element_size < sizeof(buffer) && itr != last) {
					const std::uint8_t* bytes = (const std::uint8_t*)&*itr++;
					std::copy(bytes, bytes + element_size, &buffer[size]);
					size += element_size;
				}

				if (UpdateFx(_context, buffer, size) != 1)
					BOOST_THROW_EXCEPTION(evp_error());
			}

			return itr;
		}